

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim.cpp
# Opt level: O0

bool __thiscall rw::Animation::streamWrite(Animation *this,Stream *stream)

{
  uint32 size;
  Stream *stream_local;
  Animation *this_local;
  
  size = streamGetSize(this);
  writeChunkHeader(stream,0x1b,size);
  Stream::writeI32(stream,0x100);
  Stream::writeI32(stream,this->interpInfo->id);
  Stream::writeI32(stream,this->numFrames);
  Stream::writeI32(stream,this->flags);
  Stream::writeF32(stream,this->duration);
  (*this->interpInfo->streamWrite)(stream,this);
  return true;
}

Assistant:

bool
Animation::streamWrite(Stream *stream)
{
	writeChunkHeader(stream, ID_ANIMANIMATION, this->streamGetSize());
	stream->writeI32(0x100);
	stream->writeI32(this->interpInfo->id);
	stream->writeI32(this->numFrames);
	stream->writeI32(this->flags);
	stream->writeF32(this->duration);
	this->interpInfo->streamWrite(stream, this);
	return true;
}